

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::ParallelDelaunay3d::~ParallelDelaunay3d(ParallelDelaunay3d *this)

{
  (this->super_Delaunay).super_Counted._vptr_Counted =
       (_func_int **)&PTR__ParallelDelaunay3d_001adac0;
  std::_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *)
             &this->levels_);
  std::_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *)
             &this->reorder_);
  std::_Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>::~_Vector_base
            ((_Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_> *)&this->heights_);
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  ~vector(&this->threads_);
  std::_Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>::
  ~_Vector_base((_Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_> *)
                &this->cell_thread_);
  std::_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *)
             &this->cell_next_);
  std::_Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>::~_Vector_base
            ((_Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_> *)
             &this->cell_to_cell_store_);
  std::_Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>::~_Vector_base
            ((_Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_> *)&this->cell_to_v_store_)
  ;
  Delaunay::~Delaunay(&this->super_Delaunay);
  return;
}

Assistant:

class GEOGRAM_API ParallelDelaunay3d : public Delaunay {
    public:
        ParallelDelaunay3d(coord_index_t dimension = 3);

        void set_vertices(
            index_t nb_vertices, const double* vertices
        ) override;

        index_t nearest_vertex(const double* p) const override;

        void set_BRIO_levels(const vector<index_t>& levels) override;

    private:
        vector<signed_index_t> cell_to_v_store_;
        vector<signed_index_t> cell_to_cell_store_;
        vector<index_t> cell_next_;
        vector<thread_index_t> cell_thread_;
        ThreadGroup threads_;
        bool weighted_; // true for regular triangulation.
        vector<double> heights_; // only used in weighted mode.        
        vector<index_t> reorder_;
        vector<index_t> levels_;

         bool debug_mode_;

         bool verbose_debug_mode_;

        bool benchmark_mode_;
        
        
        friend class Delaunay3dThread;
    }